

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O2

void Dch_ObjAddToFrontier(Dch_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int iVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchCnf.c"
                  ,0x108,"void Dch_ObjAddToFrontier(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if ((p->pSatVars[pObj->Id] == 0) && ((*(uint *)&pObj->field_0x18 & 7) != 1)) {
    Vec_PtrPush(p->vUsedNodes,pObj);
    iVar1 = p->nSatVars;
    p->nSatVars = iVar1 + 1;
    p->pSatVars[pObj->Id] = iVar1;
    if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
      Vec_PtrPush(vFrontier,pObj);
      return;
    }
  }
  return;
}

Assistant:

void Dch_ObjAddToFrontier( Dch_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Dch_ObjSatNum(p,pObj) )
        return;
    assert( Dch_ObjSatNum(p,pObj) == 0 );
    if ( Aig_ObjIsConst1(pObj) )
        return;
    Vec_PtrPush( p->vUsedNodes, pObj );
    Dch_ObjSetSatNum( p, pObj, p->nSatVars++ );
    if ( Aig_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}